

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_entity_sets.cc
# Opt level: O0

AllCodimMeshDataSet<bool> *
lf::mesh::utils::flagEntitiesOnBoundary
          (AllCodimMeshDataSet<bool> *__return_storage_ptr__,
          shared_ptr<const_lf::mesh::Mesh> *mesh_p)

{
  Entity *e;
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  reference ppEVar5;
  uint *puVar6;
  undefined4 extraout_var_00;
  bool *pbVar7;
  Entity *subent;
  iterator __end5;
  iterator __begin5;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range5;
  dim_t rel_codim;
  dim_t dim_mesh;
  Entity *edge;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  undefined1 local_50 [8];
  CodimMeshDataSet<unsigned_int> no_adjacent_cells;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  AllCodimMeshDataSet<bool> *bd_flags;
  
  no_adjacent_cells._48_8_ = mesh_p;
  CountNumSuperEntities((CodimMeshDataSet<unsigned_int> *)local_50,mesh_p,1,1);
  AllCodimMeshDataSet<bool>::AllCodimMeshDataSet<bool,void>
            (__return_storage_ptr__,(shared_ptr<const_lf::mesh::Mesh> *)no_adjacent_cells._48_8_,
             false);
  peVar4 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)no_adjacent_cells._48_8_);
  iVar2 = (*peVar4->_vptr_Mesh[2])(peVar4,1);
  __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar2);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  edge = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while (bVar1 = __gnu_cxx::
                 operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                           (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                     *)&edge), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar5 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2);
    e = *ppEVar5;
    puVar6 = CodimMeshDataSet<unsigned_int>::operator()
                       ((CodimMeshDataSet<unsigned_int> *)local_50,e);
    if (*puVar6 == 1) {
      peVar4 = std::
               __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)no_adjacent_cells._48_8_);
      uVar3 = (**peVar4->_vptr_Mesh)();
      for (__range5._0_4_ = 0; (uint)__range5 < uVar3; __range5._0_4_ = (uint)__range5 + 1) {
        iVar2 = (*e->_vptr_Entity[1])(e,(ulong)(uint)__range5);
        __begin5._M_current = (Entity **)CONCAT44(extraout_var_00,iVar2);
        __end5 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin5
                           );
        subent = (Entity *)
                 std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin5
                           );
        while (bVar1 = __gnu_cxx::
                       operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                 (&__end5,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                           *)&subent), ((bVar1 ^ 0xffU) & 1) != 0) {
          ppEVar5 = __gnu_cxx::
                    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                    ::operator*(&__end5);
          pbVar7 = AllCodimMeshDataSet<bool>::operator()(__return_storage_ptr__,*ppEVar5);
          *pbVar7 = true;
          __gnu_cxx::
          __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
          ::operator++(&__end5);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  CodimMeshDataSet<unsigned_int>::~CodimMeshDataSet((CodimMeshDataSet<unsigned_int> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

AllCodimMeshDataSet<bool> flagEntitiesOnBoundary(
    const std::shared_ptr<const Mesh>& mesh_p) {
  // count cells adjacent to entities of co-dimension 1
  CodimMeshDataSet<lf::base::size_type> no_adjacent_cells{
      CountNumSuperEntities(mesh_p, 1, 1)};
  // flag array
  AllCodimMeshDataSet<bool> bd_flags{mesh_p, false};

  // Run through faces (entities of co-dimension 1) and flag sub-entities
  for (const lf::mesh::Entity* edge : mesh_p->Entities(1)) {
    if (no_adjacent_cells(*edge) == 1) {
      // Boundary face detected!
      // Traverse all sub-entities of all co-dimensions
      const lf::base::dim_t dim_mesh = mesh_p->DimMesh();
      for (lf::base::dim_t rel_codim = 0; rel_codim < dim_mesh; rel_codim++) {
        for (const lf::mesh::Entity* subent : edge->SubEntities(rel_codim)) {
          bd_flags(*subent) = true;
        }
      }
    }
  }
  return bd_flags;
}